

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_function_name_abi_cxx11_
          (CompilerMSL *this,TextureFunctionNameArguments *args)

{
  MSLFormatResolution MVar1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  CompilerError *pCVar5;
  undefined4 *in_RDX;
  TypedID *local_250;
  undefined1 local_1a0 [70];
  char local_15a;
  allocator local_159;
  string local_158 [38];
  char local_132;
  allocator local_131;
  string local_130 [38];
  char local_10a;
  allocator local_109;
  string local_108 [38];
  char local_e2;
  allocator local_e1;
  string local_e0 [38];
  char local_ba;
  allocator local_b9;
  string local_b8 [38];
  undefined1 local_92;
  allocator local_91;
  string local_90 [39];
  undefined1 local_69;
  SPIRCombinedImageSampler *local_68;
  SPIRCombinedImageSampler *combined;
  allocator local_4d;
  TypedID<(spirv_cross::Types)2> local_4c;
  SPIRVariable *local_48;
  SPIRVariable *var;
  MSLConstexprSampler *pMStack_38;
  bool is_dynamic_img_sampler;
  MSLConstexprSampler *constexpr_sampler;
  SPIRType *imgtype;
  undefined4 *puStack_20;
  VariableID img;
  TextureFunctionNameArguments *args_local;
  CompilerMSL *this_local;
  string *fname;
  
  imgtype._4_4_ = *in_RDX;
  constexpr_sampler = *(MSLConstexprSampler **)(in_RDX + 2);
  pMStack_38 = (MSLConstexprSampler *)0x0;
  var._7_1_ = 0;
  puStack_20 = in_RDX;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
  local_48 = Compiler::maybe_get_backing_variable((Compiler *)args,uVar3);
  if (local_48 != (SPIRVariable *)0x0) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_48->basevariable);
    if (uVar3 == 0) {
      TypedID<(spirv_cross::Types)2>::TypedID(&local_4c,&(local_48->super_IVariant).self);
    }
    else {
      local_4c.id = (local_48->basevariable).id;
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_4c);
    pMStack_38 = find_constexpr_sampler((CompilerMSL *)args,uVar3);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_48->super_IVariant).self);
    var._7_1_ = Compiler::has_extended_decoration
                          ((Compiler *)args,uVar3,SPIRVCrossDecorationDynamicImageSampler);
  }
  if (((((args[0xec].base.field_0x15 & 1) == 0) || ((*(byte *)((long)puStack_20 + 0x11) & 1) == 0))
      || ((var._7_1_ & 1) != 0)) ||
     ((pMStack_38 != (MSLConstexprSampler *)0x0 && ((pMStack_38->ycbcr_conversion_enable & 1U) != 0)
      ))) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
    local_68 = Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>((Compiler *)args,uVar3);
    local_69 = 0;
    ::std::__cxx11::string::string((string *)this);
    bVar2 = needs_chroma_reconstruction(pMStack_38);
    if ((bVar2) && ((var._7_1_ & 1) == 0)) {
      if ((pMStack_38->planes != 2) && (pMStack_38->planes != 3)) {
        local_92 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_90,"Unhandled number of color image planes!",&local_91)
        ;
        CompilerError::CompilerError(pCVar5,(string *)local_90);
        local_92 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((pMStack_38->resolution == MSL_FORMAT_RESOLUTION_444) ||
         (pMStack_38->chroma_filter == MSL_SAMPLER_FILTER_NEAREST)) {
        if (pMStack_38->planes == 2) {
          add_spv_func_and_recompile((CompilerMSL *)args,SPVFuncImplChromaReconstructNearest2Plane);
        }
        else {
          add_spv_func_and_recompile((CompilerMSL *)args,SPVFuncImplChromaReconstructNearest3Plane);
        }
        ::std::__cxx11::string::operator=((string *)this,"spvChromaReconstructNearest");
      }
      else {
        ::std::__cxx11::string::operator=((string *)this,"spvChromaReconstructLinear");
        MVar1 = pMStack_38->resolution;
        if (MVar1 == MSL_FORMAT_RESOLUTION_444) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1f0b,
                        "virtual string spirv_cross::CompilerMSL::to_function_name(const TextureFunctionNameArguments &)"
                       );
        }
        if (MVar1 == MSL_FORMAT_RESOLUTION_422) {
          if (pMStack_38->x_chroma_offset == MSL_CHROMA_LOCATION_COSITED_EVEN) {
            if (pMStack_38->planes == 2) {
              add_spv_func_and_recompile
                        ((CompilerMSL *)args,SPVFuncImplChromaReconstructLinear422CositedEven2Plane)
              ;
            }
            else {
              add_spv_func_and_recompile
                        ((CompilerMSL *)args,SPVFuncImplChromaReconstructLinear422CositedEven3Plane)
              ;
            }
            ::std::__cxx11::string::operator+=((string *)this,"422CositedEven");
          }
          else {
            if (pMStack_38->x_chroma_offset != MSL_CHROMA_LOCATION_MIDPOINT) {
              local_ba = '\x01';
              pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string(local_b8,"Invalid chroma location.",&local_b9);
              CompilerError::CompilerError(pCVar5,(string *)local_b8);
              local_ba = '\0';
              __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            if (pMStack_38->planes == 2) {
              add_spv_func_and_recompile
                        ((CompilerMSL *)args,SPVFuncImplChromaReconstructLinear422Midpoint2Plane);
            }
            else {
              add_spv_func_and_recompile
                        ((CompilerMSL *)args,SPVFuncImplChromaReconstructLinear422Midpoint3Plane);
            }
            ::std::__cxx11::string::operator+=((string *)this,"422Midpoint");
          }
        }
        else {
          if (MVar1 != MSL_FORMAT_RESOLUTION_420) {
            local_15a = '\x01';
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_158,"Invalid format resolution.",&local_159);
            CompilerError::CompilerError(pCVar5,(string *)local_158);
            local_15a = '\0';
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          ::std::__cxx11::string::operator+=((string *)this,"420");
          if (pMStack_38->x_chroma_offset == MSL_CHROMA_LOCATION_COSITED_EVEN) {
            if (pMStack_38->y_chroma_offset == MSL_CHROMA_LOCATION_COSITED_EVEN) {
              if (pMStack_38->planes == 2) {
                add_spv_func_and_recompile
                          ((CompilerMSL *)args,
                           SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven2Plane);
              }
              else {
                add_spv_func_and_recompile
                          ((CompilerMSL *)args,
                           SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven3Plane);
              }
              ::std::__cxx11::string::operator+=((string *)this,"XCositedEvenYCositedEven");
            }
            else {
              if (pMStack_38->y_chroma_offset != MSL_CHROMA_LOCATION_MIDPOINT) {
                local_e2 = '\x01';
                pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string(local_e0,"Invalid Y chroma location.",&local_e1);
                CompilerError::CompilerError(pCVar5,(string *)local_e0);
                local_e2 = '\0';
                __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
              }
              if (pMStack_38->planes == 2) {
                add_spv_func_and_recompile
                          ((CompilerMSL *)args,
                           SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint2Plane);
              }
              else {
                add_spv_func_and_recompile
                          ((CompilerMSL *)args,
                           SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint3Plane);
              }
              ::std::__cxx11::string::operator+=((string *)this,"XCositedEvenYMidpoint");
            }
          }
          else {
            if (pMStack_38->x_chroma_offset != MSL_CHROMA_LOCATION_MIDPOINT) {
              local_132 = '\x01';
              pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string(local_130,"Invalid X chroma location.",&local_131);
              CompilerError::CompilerError(pCVar5,(string *)local_130);
              local_132 = '\0';
              __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            if (pMStack_38->y_chroma_offset == MSL_CHROMA_LOCATION_COSITED_EVEN) {
              if (pMStack_38->planes == 2) {
                add_spv_func_and_recompile
                          ((CompilerMSL *)args,
                           SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven2Plane);
              }
              else {
                add_spv_func_and_recompile
                          ((CompilerMSL *)args,
                           SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven3Plane);
              }
              ::std::__cxx11::string::operator+=((string *)this,"XMidpointYCositedEven");
            }
            else {
              if (pMStack_38->y_chroma_offset != MSL_CHROMA_LOCATION_MIDPOINT) {
                local_10a = '\x01';
                pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string(local_108,"Invalid Y chroma location.",&local_109);
                CompilerError::CompilerError(pCVar5,(string *)local_108);
                local_10a = '\0';
                __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
              }
              if (pMStack_38->planes == 2) {
                add_spv_func_and_recompile
                          ((CompilerMSL *)args,
                           SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint2Plane);
              }
              else {
                add_spv_func_and_recompile
                          ((CompilerMSL *)args,
                           SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint3Plane);
              }
              ::std::__cxx11::string::operator+=((string *)this,"XMidpointYMidpoint");
            }
          }
        }
      }
    }
    else {
      if (local_68 == (SPIRCombinedImageSampler *)0x0) {
        local_250 = (TypedID *)((long)&imgtype + 4);
      }
      else {
        local_250 = (TypedID *)&local_68->image;
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int(local_250);
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_1a0,(uint32_t)args,SUB41(uVar3,0));
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_1a0 + 0x20),local_1a0);
      ::std::__cxx11::string::operator=((string *)this,(string *)(local_1a0 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_1a0 + 0x20));
      ::std::__cxx11::string::~string((string *)local_1a0);
      if ((*(byte *)(puStack_20 + 4) & 1) == 0) {
        if ((*(byte *)((long)puStack_20 + 0x11) & 1) == 0) {
          ::std::__cxx11::string::operator+=((string *)this,"sample");
        }
        else {
          ::std::__cxx11::string::operator+=((string *)this,"gather");
        }
      }
      else {
        ::std::__cxx11::string::operator+=((string *)this,"read");
      }
      if ((*(byte *)((long)puStack_20 + 0x1b) & 1) != 0) {
        ::std::__cxx11::string::operator+=((string *)this,"_compare");
      }
    }
  }
  else {
    add_spv_func_and_recompile
              ((CompilerMSL *)args,
               ((byte)(char)constexpr_sampler[2].chroma_filter & 1) + SPVFuncImplGatherSwizzle);
    pcVar4 = "spvGatherSwizzle";
    if ((constexpr_sampler[2].chroma_filter & MSL_SAMPLER_FILTER_LINEAR) !=
        MSL_SAMPLER_FILTER_NEAREST) {
      pcVar4 = "spvGatherCompareSwizzle";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar4,&local_4d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4d);
  }
  return this;
}

Assistant:

string CompilerMSL::to_function_name(const TextureFunctionNameArguments &args)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;

	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	// Special-case gather. We have to alter the component being looked up
	// in the swizzle case.
	if (msl_options.swizzle_texture_samples && args.base.is_gather && !is_dynamic_img_sampler &&
	    (!constexpr_sampler || !constexpr_sampler->ycbcr_conversion_enable))
	{
		add_spv_func_and_recompile(imgtype.image.depth ? SPVFuncImplGatherCompareSwizzle : SPVFuncImplGatherSwizzle);
		return imgtype.image.depth ? "spvGatherCompareSwizzle" : "spvGatherSwizzle";
	}

	auto *combined = maybe_get<SPIRCombinedImageSampler>(img);

	// Texture reference
	string fname;
	if (needs_chroma_reconstruction(constexpr_sampler) && !is_dynamic_img_sampler)
	{
		if (constexpr_sampler->planes != 2 && constexpr_sampler->planes != 3)
			SPIRV_CROSS_THROW("Unhandled number of color image planes!");
		// 444 images aren't downsampled, so we don't need to do linear filtering.
		if (constexpr_sampler->resolution == MSL_FORMAT_RESOLUTION_444 ||
		    constexpr_sampler->chroma_filter == MSL_SAMPLER_FILTER_NEAREST)
		{
			if (constexpr_sampler->planes == 2)
				add_spv_func_and_recompile(SPVFuncImplChromaReconstructNearest2Plane);
			else
				add_spv_func_and_recompile(SPVFuncImplChromaReconstructNearest3Plane);
			fname = "spvChromaReconstructNearest";
		}
		else // Linear with a downsampled format
		{
			fname = "spvChromaReconstructLinear";
			switch (constexpr_sampler->resolution)
			{
			case MSL_FORMAT_RESOLUTION_444:
				assert(false);
				break; // not reached
			case MSL_FORMAT_RESOLUTION_422:
				switch (constexpr_sampler->x_chroma_offset)
				{
				case MSL_CHROMA_LOCATION_COSITED_EVEN:
					if (constexpr_sampler->planes == 2)
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422CositedEven2Plane);
					else
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422CositedEven3Plane);
					fname += "422CositedEven";
					break;
				case MSL_CHROMA_LOCATION_MIDPOINT:
					if (constexpr_sampler->planes == 2)
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422Midpoint2Plane);
					else
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422Midpoint3Plane);
					fname += "422Midpoint";
					break;
				default:
					SPIRV_CROSS_THROW("Invalid chroma location.");
				}
				break;
			case MSL_FORMAT_RESOLUTION_420:
				fname += "420";
				switch (constexpr_sampler->x_chroma_offset)
				{
				case MSL_CHROMA_LOCATION_COSITED_EVEN:
					switch (constexpr_sampler->y_chroma_offset)
					{
					case MSL_CHROMA_LOCATION_COSITED_EVEN:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven3Plane);
						fname += "XCositedEvenYCositedEven";
						break;
					case MSL_CHROMA_LOCATION_MIDPOINT:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint3Plane);
						fname += "XCositedEvenYMidpoint";
						break;
					default:
						SPIRV_CROSS_THROW("Invalid Y chroma location.");
					}
					break;
				case MSL_CHROMA_LOCATION_MIDPOINT:
					switch (constexpr_sampler->y_chroma_offset)
					{
					case MSL_CHROMA_LOCATION_COSITED_EVEN:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven3Plane);
						fname += "XMidpointYCositedEven";
						break;
					case MSL_CHROMA_LOCATION_MIDPOINT:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint2Plane);
						else
							add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint3Plane);
						fname += "XMidpointYMidpoint";
						break;
					default:
						SPIRV_CROSS_THROW("Invalid Y chroma location.");
					}
					break;
				default:
					SPIRV_CROSS_THROW("Invalid X chroma location.");
				}
				break;
			default:
				SPIRV_CROSS_THROW("Invalid format resolution.");
			}
		}
	}
	else
	{
		fname = to_expression(combined ? combined->image : img) + ".";

		// Texture function and sampler
		if (args.base.is_fetch)
			fname += "read";
		else if (args.base.is_gather)
			fname += "gather";
		else
			fname += "sample";

		if (args.has_dref)
			fname += "_compare";
	}

	return fname;
}